

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMNodeIDMap::add(DOMNodeIDMap *this,DOMAttr *attr)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  ushort *puVar3;
  
  if (this->fMaxEntries <= this->fNumEntries) {
    growTable(this);
  }
  this->fNumEntries = this->fNumEntries + 1;
  iVar2 = (*(attr->super_DOMNode)._vptr_DOMNode[0x2a])(attr);
  puVar3 = (ushort *)CONCAT44(extraout_var,iVar2);
  uVar1 = this->fSize;
  uVar4 = 1;
  if ((puVar3 != (ushort *)0x0) && (uVar5 = (ulong)*puVar3, uVar5 != 0)) {
    uVar6 = puVar3[1];
    if (uVar6 != 0) {
      puVar3 = puVar3 + 2;
      do {
        uVar5 = (ulong)uVar6 + (uVar5 >> 0x18) + uVar5 * 0x26;
        uVar6 = *puVar3;
        puVar3 = puVar3 + 1;
      } while (uVar6 != 0);
    }
    uVar4 = uVar5 % (uVar1 - 1) + 1;
  }
  uVar5 = uVar4;
  while ((undefined1 *)0x1 <
         (undefined1 *)((long)&(this->fTable[uVar5]->super_DOMNode)._vptr_DOMNode + 1U)) {
    uVar5 = uVar5 + uVar4;
    if (uVar1 <= uVar5) {
      uVar5 = uVar5 % uVar1;
    }
  }
  this->fTable[uVar5] = attr;
  return;
}

Assistant:

void DOMNodeIDMap::add(DOMAttr *attr)
{
	//
	//  If the table is getting too full, grow it.  We arbitrarily limit
	//   the table to 80 full, which should limit the average number of
	//   rehashes to a reasonable value.
	//
	if (fNumEntries >= fMaxEntries)
		growTable();

        fNumEntries++;

	//
	// Hash the value string from the ID attribute being added to the table
	//      0 < Initial hash value < table size.
	//      An initial hash of zero would cause the rehash to fail.
	//
	const XMLCh *id=attr->getValue();
        XMLSize_t initalHash = XMLString::hash(id, fSize-1);
	initalHash++;
	XMLSize_t currentHash = initalHash;

	//
	// Loop looking for an empty slot for this ID.
	//   Don't even bother checking to see if the ID is already there -
	//   the table is only filled by the parser from valid documents, which
	//   can not have duplicates.  Behavior of invalid docs is not defined.
	//
    while (fTable[currentHash]!=0 && fTable[currentHash]!=(DOMAttr *)-1)
	{
		currentHash += initalHash;  // rehash
        if (currentHash >= fSize)
            currentHash = currentHash % fSize;
    }

    //
    // We've found our slot.  Stick the pointer to the attr into it.
    //
    fTable[currentHash] = attr;

}